

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Totals * __thiscall
Catch::Runner::runTestsForGroup
          (Totals *__return_storage_ptr__,Runner *this,RunContext *context,
          TestCaseFilters *filterGroup)

{
  Counts *pCVar1;
  TestCase *pTVar2;
  pointer pcVar3;
  IStreamingReporter *pIVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  IRegistryHub *pIVar8;
  undefined4 extraout_var;
  long *plVar9;
  undefined4 extraout_var_00;
  long lVar10;
  iterator iVar11;
  TestCase *testCase;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  Totals local_78;
  Totals *local_50;
  Runner *local_48;
  size_t local_40;
  _Base_ptr local_38;
  
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->testCases).failed = 0;
  local_88 = (undefined1  [16])0x0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  pIVar8 = getRegistryHub();
  iVar6 = (*pIVar8->_vptr_IRegistryHub[3])(pIVar8);
  plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x10))
                             ((long *)CONCAT44(extraout_var,iVar6));
  testCase = (TestCase *)*plVar9;
  pIVar8 = getRegistryHub();
  iVar6 = (*pIVar8->_vptr_IRegistryHub[3])(pIVar8);
  lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x10))
                     ((long *)CONCAT44(extraout_var_00,iVar6));
  pTVar2 = *(TestCase **)(lVar10 + 8);
  local_48 = this;
  if (testCase == pTVar2) {
    (__return_storage_ptr__->assertions).passed = 0;
  }
  else {
    local_38 = &(this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header._M_header;
    iVar6 = 0;
    local_98 = (undefined1  [16])0x0;
    local_50 = __return_storage_ptr__;
    do {
      bVar5 = TestCaseFilters::shouldInclude(filterGroup,testCase);
      if (bVar5) {
        iVar6 = iVar6 + 1;
        iVar11 = std::
                 _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
                 ::find(&(this->m_testsAlreadyRun)._M_t,testCase);
        if (iVar11._M_node == local_38) {
          local_40 = (context->m_totals).assertions.failed;
          iVar7 = (*(((context->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable
                    [10])();
          if (local_40 == (long)iVar7) break;
          RunContext::runTest(&local_78,context,testCase);
          local_88._8_8_ = local_88._8_8_ + local_78.assertions.failed;
          local_88._0_8_ = local_88._0_8_ + local_78.assertions.passed;
          local_98._8_8_ = local_98._8_8_ + local_78.testCases.failed;
          local_98._0_8_ = local_98._0_8_ + local_78.testCases.passed;
          std::
          _Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
          ::_M_insert_unique<Catch::TestCase_const&>
                    ((_Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
                      *)&this->m_testsAlreadyRun,testCase);
        }
      }
      testCase = testCase + 1;
    } while (testCase != pTVar2);
    (local_50->testCases).passed = local_98._0_8_;
    (local_50->testCases).failed = local_98._8_8_;
    (local_50->assertions).passed = local_88._0_8_;
    (local_50->assertions).failed = local_88._8_8_;
    __return_storage_ptr__ = local_50;
    if (iVar6 != 0) {
      return local_50;
    }
  }
  pCVar1 = &local_78.testCases;
  pcVar3 = (filterGroup->m_name)._M_dataplus._M_p;
  local_78.assertions.passed = (size_t)pCVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (filterGroup->m_name)._M_string_length);
  if ((Counts *)local_78.assertions.passed != pCVar1) {
    operator_delete((void *)local_78.assertions.passed);
  }
  if (local_78.assertions.failed != 0) {
    pIVar4 = (local_48->m_reporter).m_p;
    pcVar3 = (filterGroup->m_name)._M_dataplus._M_p;
    local_78.assertions.passed = (size_t)pCVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar3,pcVar3 + (filterGroup->m_name)._M_string_length);
    (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[5])(pIVar4,&local_78);
    if ((Counts *)local_78.assertions.passed != pCVar1) {
      operator_delete((void *)local_78.assertions.passed);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Totals runTestsForGroup( RunContext& context, const TestCaseFilters& filterGroup ) {
            Totals totals;
            std::vector<TestCase>::const_iterator it = getRegistryHub().getTestCaseRegistry().getAllTests().begin();
            std::vector<TestCase>::const_iterator itEnd = getRegistryHub().getTestCaseRegistry().getAllTests().end();
            int testsRunForGroup = 0;
            for(; it != itEnd; ++it ) {
                if( filterGroup.shouldInclude( *it ) ) {
                    testsRunForGroup++;
                    if( m_testsAlreadyRun.find( *it ) == m_testsAlreadyRun.end() ) {

                        if( context.aborting() )
                            break;

                        totals += context.runTest( *it );
                        m_testsAlreadyRun.insert( *it );
                    }
                }
            }
            if( testsRunForGroup == 0 && !filterGroup.getName().empty() )
                m_reporter->noMatchingTestCases( filterGroup.getName() );
            return totals;

        }